

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O2

Option<Kernel::PolyNf> * __thiscall
Inferences::PolynomialEvaluation::evaluate
          (Option<Kernel::PolyNf> *__return_storage_ptr__,PolynomialEvaluation *this,
          PolyNf *normalized)

{
  long lVar1;
  long lVar2;
  Self SVar3;
  Self SVar4;
  MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf> *this_00;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar5;
  bool bVar6;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar7;
  uint uVar8;
  int iVar9;
  Entry *pEVar10;
  Entry *this_01;
  Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> recResults;
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  recState;
  PolyNf *argLst;
  anon_class_24_3_9e03d13b local_1f8;
  BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
  local_1e0;
  PolyNf out;
  PolyNf local_1a0;
  anon_class_24_3_9e03d13b local_188;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_168;
  PolyNf eval;
  PolyNf local_138;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_120;
  PolyNf local_108;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_f0;
  BottomUpChildIter<Kernel::PolyNf> local_d8;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_b4;
  BottomUpChildIter<Kernel::PolyNf> local_9c;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_78;
  Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
  local_60;
  PolyNf t;
  
  if ((evaluate(Kernel::PolyNf)::memo == '\0') &&
     (iVar9 = __cxa_guard_acquire(&evaluate(Kernel::PolyNf)::memo), iVar9 != 0)) {
    Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::Map(&evaluate::memo._memo);
    __cxa_atexit(MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::~MemoNonVars,&evaluate::memo,
                 &__dso_handle);
    __cxa_guard_release(&evaluate(Kernel::PolyNf)::memo);
  }
  local_1e0._memo = &evaluate::memo;
  Lib::
  Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&recState);
  Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&recResults);
  SVar4 = recState._self;
  Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  ::DefaultImpl(&local_f0,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                 *)normalized);
  Lib::
  Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  ::
  match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>
            (&local_d8,
             (Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
              *)&local_f0);
  Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::push
            ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
             SVar4._M_t.
             super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
             .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
             _M_head_impl,&local_d8);
  do {
    while( true ) {
      if (*(long *)((long)recState._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                          ._M_head_impl + 0x10) ==
          *(long *)((long)recState._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                          ._M_head_impl + 8)) {
        Lib::Stack<Kernel::PolyNf>::pop
                  (&out,(Stack<Kernel::PolyNf> *)
                        recResults._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl);
        Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled(&recResults);
        Lib::
        Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&recState);
        bVar6 = Kernel::operator!=(&out,normalized);
        if (bVar6) {
          Lib::CoproductImpl::TrivialOperations::CopyCons::
          DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
          ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                         *)&local_d8,
                        (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                         *)&out);
          Lib::OptionBase<Kernel::PolyNf>::OptionBase
                    (&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>,(PolyNf *)&local_d8);
        }
        else {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>)._elem._elem + 8) = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>)._elem._elem + 0x10) =
               0;
          *(undefined8 *)&__return_storage_ptr__->super_OptionBase<Kernel::PolyNf> = 0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super_OptionBase<Kernel::PolyNf>)._elem._elem + 4) = 0;
        }
        return __return_storage_ptr__;
      }
      RVar5 = Lib::
              Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              ::
              apply<Lib::BottomUpChildIter<Kernel::PolyNf>::hasNext(std::tuple<>)const::_lambda(auto:1&)_1_>
                        ((Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                          *)(*(long *)((long)recState._self._M_t.
                                             super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                                             .
                                             super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                                             ._M_head_impl + 0x10) + -0x24));
      if (!RVar5) break;
      Lib::BottomUpChildIter<Kernel::PolyNf>::next
                ((EVP_PKEY_CTX *)&t,
                 (BottomUpChildIter<Kernel::PolyNf> *)
                 (*(long *)((long)recState._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                                  ._M_head_impl + 0x10) + -0x24));
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl(&local_78,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&t);
      MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>::get
                ((Option<Kernel::PolyNf> *)&out,local_1e0._memo,&t);
      SVar4 = recState._self;
      SVar3 = recResults._self;
      if (out.super_PolyNfSuper._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
          ._0_1_ == '\x01') {
        Lib::CoproductImpl::TrivialOperations::MoveCons::
        DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)&local_108,
                      (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       *)(out.super_PolyNfSuper._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                          .
                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                          ._content + 3));
        Lib::Stack<Kernel::PolyNf>::push
                  ((Stack<Kernel::PolyNf> *)
                   SVar3._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl,
                   &local_108);
      }
      else {
        Lib::CoproductImpl::TrivialOperations::CopyCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
        ::DefaultImpl(&local_120,
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)&t);
        Lib::
        Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::
        match<Lib::BottomUpChildIter<Kernel::PolyNf>::BottomUpChildIter(Kernel::PolyNf,std::tuple<>)::_lambda(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::Variable)_1_,Lib::BottomUpChildIter<Kernel::PolyNf>::tuple(Kernel::PolyNf,std::tuple<>)::_lambda(Kernel::AnyPoly)_1_>
                  (&local_9c,
                   (Coproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                    *)&local_120);
        Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::push
                  ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
                   SVar4._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>
                   ._M_head_impl,&local_9c);
      }
    }
    Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::pop
              ((BottomUpChildIter<Kernel::PolyNf> *)&out,
               (Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)
               recState._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_>_>
               .super__Head_base<0UL,_Lib::Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>_*,_false>.
               _M_head_impl);
    RVar7 = Lib::
            Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            ::
            apply<Lib::BottomUpChildIter<Kernel::PolyNf>::nChildren(std::tuple<>)const::_lambda(auto:1&)_1_>
                      ((Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                        *)&out);
    SVar3 = recResults._self;
    if (RVar7 == 0) {
      argLst = (PolyNf *)0x0;
    }
    else {
      lVar1 = *(long *)((long)recResults._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                              _M_head_impl + 8);
      lVar2 = *(long *)((long)recResults._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                              _M_head_impl + 0x10);
      RVar7 = Lib::
              Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
              ::
              apply<Lib::BottomUpChildIter<Kernel::PolyNf>::nChildren(std::tuple<>)const::_lambda(auto:1&)_1_>
                        ((Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                          *)&out);
      argLst = (PolyNf *)
               (((lVar2 - lVar1) / 0x18 - (ulong)RVar7) * 0x18 +
               *(long *)((long)SVar3._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
                               .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>.
                               _M_head_impl + 8));
    }
    this_00 = local_1e0._memo;
    Lib::
    Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
    ::apply<Lib::BottomUpChildIter<Kernel::PolyNf>::self(std::tuple<>)const::_lambda(auto:1&)_1_>
              (&local_168,
               (Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                *)&out);
    local_1f8.this = &local_1e0;
    local_1f8.argLst = &argLst;
    local_1f8.orig = (BottomUpChildIter<Kernel::PolyNf> *)&out;
    if ((local_168.
         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
         .
         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         ._0_1_ & 3) == 1) {
      Lib::
      BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
      ::apply::anon_class_24_3_9e03d13b::operator()(&eval,&local_1f8);
    }
    else {
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl(&local_b4,&local_168);
      local_188.argLst = local_1f8.argLst;
      local_188.this = local_1f8.this;
      local_188.orig = local_1f8.orig;
      Lib::CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)&local_60,
                    &local_b4.
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   );
      if (*(int *)((long)this_00 + 0x18) <= *(int *)((long)this_00 + 4)) {
        Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::expand(&this_00->_memo);
      }
      uVar8 = Lib::
              Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              ::defaultHash(&local_60);
      uVar8 = uVar8 + (uVar8 == 0);
      pEVar10 = *(Entry **)((long)this_00 + 8);
      this_01 = pEVar10 + (ulong)uVar8 % (ulong)*(uint *)&this_00->_memo;
      while (this_01->code != 0) {
        if (this_01->code == uVar8) {
          bVar6 = Kernel::operator==((PolyNf *)&(this_01->_key).__align,(PolyNf *)&local_60);
          if (bVar6) {
            Lib::CoproductImpl::TrivialOperations::MoveCons::
            DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&local_1a0,
                          (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&(this_01->_value).__align);
            Lib::CoproductImpl::TrivialOperations::MoveCons::
            DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&t,(DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                 *)&local_1a0);
            Lib::CoproductImpl::TrivialOperations::MoveCons::
            DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            ::operator=((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         *)&(this_01->_value).__align,
                        (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                         *)&t);
            goto LAB_0040a14e;
          }
          pEVar10 = *(Entry **)((long)this_00 + 8);
        }
        this_01 = this_01 + 1;
        if (this_01 == *(Entry **)((long)this_00 + 0x10)) {
          this_01 = pEVar10;
        }
      }
      *(int *)((long)this_00 + 4) = *(int *)((long)this_00 + 4) + 1;
      Lib::CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     *)&t,(DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                           *)&local_60);
      Lib::
      BottomUpEvaluation<Kernel::PolyNf,_Kernel::PolyNf,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PolynomialEvaluation.cpp:224:9),_Lib::ReturnNone<Kernel::PolyNf>,_MemoNonVars<Kernel::PolyNf,_Kernel::PolyNf>_&,_std::tuple<>_>
      ::apply::anon_class_24_3_9e03d13b::operator()(&local_1a0,&local_188);
      Lib::Map<Kernel::PolyNf,_Kernel::PolyNf,_Lib::DefaultHash>::Entry::init
                (this_01,(EVP_PKEY_CTX *)&t);
LAB_0040a14e:
      Lib::CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&eval,(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                              *)&(this_01->_value).__align);
    }
    SVar3._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl =
         recResults._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl;
    RVar7 = Lib::
            Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
            ::
            apply<Lib::BottomUpChildIter<Kernel::PolyNf>::nChildren(std::tuple<>)const::_lambda(auto:1&)_1_>
                      ((Coproduct<Lib::BottomUpChildIter<Kernel::PolyNf>::FuncTermBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::VariableBottomUpChildIter,Lib::BottomUpChildIter<Kernel::PolyNf>::PolynomialBottomUpChildIter>
                        *)&out);
    Lib::Stack<Kernel::PolyNf>::pop
              ((Stack<Kernel::PolyNf> *)
               SVar3._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl,RVar7);
    SVar3 = recResults._self;
    Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   *)&local_138,
                  (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                   *)&eval);
    Lib::Stack<Kernel::PolyNf>::push
              ((Stack<Kernel::PolyNf> *)
               SVar3._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl,&local_138);
  } while( true );
}

Assistant:

Option<PolyNf> PolynomialEvaluation::evaluate(PolyNf normalized) const 
{
  static MemoNonVars<PolyNf, PolyNf> memo;
  auto out = BottomUpEvaluation<PolyNf, PolyNf>()
    .function(
        [&](PolyNf orig, PolyNf* ts) -> PolyNf 
        { 
          return orig.match(
              [&](Perfect<FuncTerm> f)
              { 
                return f->function().tryInterpret()
                  .andThen( [&](Theory::Interpretation && i)  -> Option<PolyNf>
                    { return trySimplify(i, ts); })
                  .unwrapOrElse([&]() -> PolyNf
                    { return PolyNf(perfect(FuncTerm(f->function(), ts))); });

              }, 

              [&](Variable v) 
              { return PolyNf(v); },

              [&](AnyPoly p) 
              { return PolyNf(simplifyPoly(p, ts, /*removeZeros=*/true)); }
          );
        })
    .memo<decltype(memo)&>(memo)
    .apply(normalized);
  auto outOpt = someIf(out != normalized, [&]() { return out; });
  DEBUG("evaluated ", normalized, " ==> ", outOpt)
  return outOpt;
}